

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O1

long testCreateNewOrderSingle(int count)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  ClOrdID clOrdID;
  Side side;
  Symbol symbol;
  HandlInst handlInst;
  OrdType ordType;
  TransactTime transactTime;
  undefined1 local_390 [16];
  _Alloc_hider local_380;
  char local_370 [16];
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  field_metrics local_340;
  FieldBase local_338;
  undefined1 local_2e0 [16];
  _Alloc_hider local_2d0;
  char local_2c0 [16];
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  field_metrics local_290;
  FieldBase local_288;
  FieldBase local_230;
  FieldBase local_1d8;
  Message local_180 [344];
  
  gettimeofday((timeval *)local_390,(__timezone_ptr_t)0x0);
  uVar2 = local_390._0_8_;
  lVar1 = CONCAT44(local_390._12_4_,local_390._8_4_);
  if (-1 < count) {
    iVar3 = count + 1;
    do {
      local_288._vptr_FieldBase = (_func_int **)&local_288.m_string;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"ORDERID","");
      local_390._0_8_ = &PTR__FieldBase_0011c4b8;
      local_390._8_4_ = 0xb;
      local_380._M_p = local_370;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_380,local_288._vptr_FieldBase,
                 (long)&((_Alloc_hider *)local_288._vptr_FieldBase)->_M_p + local_288._8_8_);
      local_360._M_p = (pointer)&local_350;
      local_358 = 0;
      local_350._M_local_buf[0] = '\0';
      local_340.m_length = 0;
      local_340.m_checksum = 0;
      local_390._0_8_ = &PTR__FieldBase_0011c538;
      if ((string *)local_288._vptr_FieldBase != &local_288.m_string) {
        operator_delete(local_288._vptr_FieldBase,(ulong)(local_288.m_string._M_dataplus._M_p + 1));
      }
      FIX::CharField::CharField((CharField *)&local_288,0x15,'1');
      local_288._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c570;
      local_338._vptr_FieldBase = (_func_int **)&local_338.m_string;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"LNUX","");
      local_2e0._0_8_ = &PTR__FieldBase_0011c4b8;
      local_2e0._8_4_ = 0x37;
      local_2d0._M_p = local_2c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,local_338._vptr_FieldBase,
                 (long)&((_Alloc_hider *)local_338._vptr_FieldBase)->_M_p + local_338._8_8_);
      local_2b0._M_p = (pointer)&local_2a0;
      local_2a8 = 0;
      local_2a0._M_local_buf[0] = '\0';
      local_290.m_length = 0;
      local_290.m_checksum = 0;
      local_2e0._0_8_ = &PTR__FieldBase_0011c5e0;
      if ((string *)local_338._vptr_FieldBase != &local_338.m_string) {
        operator_delete(local_338._vptr_FieldBase,(ulong)(local_338.m_string._M_dataplus._M_p + 1));
      }
      FIX::CharField::CharField((CharField *)&local_338,0x36,'1');
      local_338._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c618;
      FIX::TransactTime::now();
      FIX::CharField::CharField((CharField *)&local_230,0x28,'1');
      local_230._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c6c0;
      FIX42::NewOrderSingle::NewOrderSingle
                ((NewOrderSingle *)local_180,(ClOrdID *)local_390,(HandlInst *)&local_288,
                 (Symbol *)local_2e0,(Side *)&local_338,(TransactTime *)&local_1d8,
                 (OrdType *)&local_230);
      FIX::Message::~Message(local_180);
      FIX::FieldBase::~FieldBase(&local_230);
      FIX::FieldBase::~FieldBase(&local_1d8);
      FIX::FieldBase::~FieldBase(&local_338);
      FIX::FieldBase::~FieldBase((FieldBase *)local_2e0);
      FIX::FieldBase::~FieldBase(&local_288);
      FIX::FieldBase::~FieldBase((FieldBase *)local_390);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  gettimeofday((timeval *)local_390,(__timezone_ptr_t)0x0);
  return (CONCAT44(local_390._12_4_,local_390._8_4_) -
         (lVar1 + (long)((double)(long)uVar2 * 1000000.0))) +
         (long)((double)(long)local_390._0_8_ * 1000000.0);
}

Assistant:

long testCreateNewOrderSingle(int count) {
  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::ClOrdID clOrdID("ORDERID");
    FIX::HandlInst handlInst('1');
    FIX::Symbol symbol("LNUX");
    FIX::Side side(FIX::Side_BUY);
    FIX::TransactTime transactTime = FIX::TransactTime::now();
    FIX::OrdType ordType(FIX::OrdType_MARKET);
    FIX42::NewOrderSingle(clOrdID, handlInst, symbol, side, transactTime, ordType);
  }

  return GetTickCount() - start;
}